

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall backend::codegen::Codegen::translate_branch(Codegen *this,JumpInstruction *j)

{
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  *this_00;
  JumpInstructionKind JVar1;
  pointer puVar2;
  Inst *pIVar3;
  undefined8 uVar4;
  LabelId LVar5;
  LabelId LVar6;
  bool bVar7;
  undefined3 uVar8;
  char cVar9;
  ConditionCode CVar10;
  VarId *pVVar11;
  undefined8 *puVar12;
  undefined8 *puVar13;
  char *pcVar14;
  Inst *pIVar15;
  Inst *pIVar16;
  pointer *__ptr;
  uint32_t in_R8D;
  string_view function_name;
  string_view function_name_00;
  string_view function_name_01;
  string_view function_name_02;
  string_view function_name_03;
  string_view function_name_04;
  _Head_base<0UL,_arm::Arith2Inst_*,_false> local_88;
  _Head_base<0UL,_arm::Arith2Inst_*,_false> local_80;
  undefined1 local_78 [4];
  undefined1 local_74 [4];
  undefined1 local_70 [32];
  VarId local_50;
  VarId local_40;
  
  LVar5 = (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
          super__Optional_payload_base<backend::codegen::LastJump>._M_payload._M_value.bb_true;
  LVar6 = (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
          super__Optional_payload_base<backend::codegen::LastJump>._M_payload._M_value.bb_false;
  bVar7 = (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
          super__Optional_payload_base<backend::codegen::LastJump>._M_engaged;
  uVar8 = *(undefined3 *)
           &(this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>.
            _M_payload.super__Optional_payload_base<backend::codegen::LastJump>.field_0xd;
  *(undefined4 *)
   &(this->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
    super__Optional_payload_base<backend::codegen::LastJump>._M_payload =
       *(undefined4 *)
        &(this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
         super__Optional_payload_base<backend::codegen::LastJump>._M_payload;
  (this->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
  super__Optional_payload_base<backend::codegen::LastJump>._M_payload._M_value.bb_true = LVar5;
  (this->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
  super__Optional_payload_base<backend::codegen::LastJump>._M_payload._M_value.bb_false = LVar6;
  (this->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
  super__Optional_payload_base<backend::codegen::LastJump>._M_engaged = bVar7;
  *(undefined3 *)
   &(this->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
    super__Optional_payload_base<backend::codegen::LastJump>.field_0xd = uVar8;
  cVar9 = (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
          super__Optional_payload_base<backend::codegen::LastJump>._M_engaged;
  if ((bool)cVar9 == true) {
    (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
    super__Optional_payload_base<backend::codegen::LastJump>._M_engaged = false;
    cVar9 = '\0';
  }
  JVar1 = j->kind;
  if (3 < (ulong)JVar1) {
    return;
  }
  pcVar14 = (char *)((long)&switchD_00154b5f::switchdataD_0019336c +
                    (long)(int)(&switchD_00154b5f::switchdataD_0019336c)[JVar1]);
  switch(JVar1) {
  case Undefined:
    puVar12 = (undefined8 *)__cxa_allocate_exception(8);
    puVar13 = (undefined8 *)operator_new(8);
    *puVar13 = std::__cxx11::string::operator=;
    *puVar12 = puVar13;
    __cxa_throw(puVar12,&std::exception*::typeinfo,0);
  case Return:
    if ((j->cond_or_ret).super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
        super__Optional_payload_base<mir::inst::VarId>._M_engaged == true) {
      local_78 = (undefined1  [4])0x6;
      local_74 = (undefined1  [4])arm::make_register(GeneralPurpose,0);
      pVVar11 = std::optional<mir::inst::VarId>::value(&j->cond_or_ret);
      local_50.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
      local_50.id = pVVar11->id;
      local_70._8_4_ = translate_var_reg(this,&local_50);
      pcVar14 = local_70;
      local_70._0_8_ = &PTR_display_001db7d0;
      local_70._12_2_ = 1;
      std::make_unique<arm::Arith2Inst,arm::OpCode,unsigned_int,arm::RegisterOperand>
                ((OpCode *)&local_80,(uint *)local_78,(RegisterOperand *)local_74);
      local_88._M_head_impl = local_80._M_head_impl;
      local_80._M_head_impl = (Arith2Inst *)0x0;
      std::
      vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
      ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                  *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_88)
      ;
      if (local_88._M_head_impl != (Arith2Inst *)0x0) {
        (*((local_88._M_head_impl)->super_Inst).super_Displayable._vptr_Displayable[2])();
      }
      local_88._M_head_impl = (Arith2Inst *)0x0;
      std::unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_>::~unique_ptr
                ((unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> *)&local_80);
    }
    local_78 = (undefined1  [4])0x1;
    function_name._M_str = pcVar14;
    function_name._M_len = (size_t)(this->func->name)._M_dataplus._M_p;
    format_fn_end_label_abi_cxx11_
              ((string *)local_70,(codegen *)(this->func->name)._M_string_length,function_name);
    std::make_unique<arm::BrInst,arm::OpCode,std::__cxx11::string>
              ((OpCode *)&local_80,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    local_88._M_head_impl = local_80._M_head_impl;
    local_80._M_head_impl = (Arith2Inst *)0x0;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_88);
    break;
  case BrCond:
    this_00 = &this->inst;
    puVar2 = (this->inst).
             super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (((8 < (ulong)((long)puVar2 -
                     (long)(this->inst).
                           super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)) &&
        (pIVar15 = puVar2[-2]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                   ._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                   super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl, pIVar15->op == Mov)) &&
       (pIVar3 = puVar2[-1]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                 _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                 super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl, pIVar3->op == Mov)) {
      if ((pIVar15->super_Displayable)._vptr_Displayable != (_func_int **)&PTR_display_001db940) {
        pIVar15 = (Inst *)0x0;
      }
      pIVar16 = (Inst *)0x0;
      if ((pIVar3->super_Displayable)._vptr_Displayable == (_func_int **)&PTR_display_001db940) {
        pIVar16 = pIVar3;
      }
      if (((((*(int *)&pIVar15[1].super_Displayable._vptr_Displayable ==
              *(int *)&pIVar16[1].super_Displayable._vptr_Displayable) &&
            (*(char *)&pIVar15[3].super_Displayable._vptr_Displayable == '\x01')) &&
           ((*(int *)&pIVar15[2].super_Displayable._vptr_Displayable == 0 &&
            ((*(char *)&pIVar16[3].super_Displayable._vptr_Displayable == '\x01' &&
             (*(int *)&pIVar16[2].super_Displayable._vptr_Displayable == 1)))))) &&
          (pIVar15->cond == Always)) && (CVar10 = pIVar16->cond, CVar10 != Always)) {
        uVar4 = *(undefined8 *)&j->bb_true;
        (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
        super__Optional_payload_base<backend::codegen::LastJump>._M_payload._M_value.cond = CVar10;
        *(undefined8 *)
         ((long)&(this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>.
                 _M_payload.super__Optional_payload_base<backend::codegen::LastJump>._M_payload + 4)
             = uVar4;
        if (cVar9 == '\0') {
          (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
          super__Optional_payload_base<backend::codegen::LastJump>._M_engaged = true;
        }
        std::
        vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
        ::pop_back(this_00);
        std::
        vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
        ::pop_back(this_00);
        local_78 = (undefined1  [4])0x1;
        function_name_03._M_str._0_4_ = j->bb_false;
        function_name_03._M_len = (size_t)(this->func->name)._M_dataplus._M_p;
        function_name_03._M_str._4_4_ = 0;
        format_bb_label_abi_cxx11_
                  ((string *)local_70,(codegen *)(this->func->name)._M_string_length,
                   function_name_03,in_R8D);
        CVar10 = arm::invert_cond(CVar10);
        local_74[0] = CVar10;
        std::make_unique<arm::BrInst,arm::OpCode,std::__cxx11::string,arm::ConditionCode>
                  ((OpCode *)&local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                   local_70);
        local_88._M_head_impl = local_80._M_head_impl;
        local_80._M_head_impl = (Arith2Inst *)0x0;
        std::
        vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
        ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                  ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                    *)this_00,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_88);
        if (local_88._M_head_impl != (Arith2Inst *)0x0) {
          (*((local_88._M_head_impl)->super_Inst).super_Displayable._vptr_Displayable[2])();
        }
        local_88._M_head_impl = (Arith2Inst *)0x0;
        std::unique_ptr<arm::BrInst,_std::default_delete<arm::BrInst>_>::~unique_ptr
                  ((unique_ptr<arm::BrInst,_std::default_delete<arm::BrInst>_> *)&local_80);
        std::__cxx11::string::~string((string *)local_70);
        local_78 = (undefined1  [4])0x1;
        function_name_04._M_str._0_4_ = j->bb_true;
        function_name_04._M_len = (size_t)(this->func->name)._M_dataplus._M_p;
        function_name_04._M_str._4_4_ = 0;
        format_bb_label_abi_cxx11_
                  ((string *)local_70,(codegen *)(this->func->name)._M_string_length,
                   function_name_04,in_R8D);
        std::make_unique<arm::BrInst,arm::OpCode,std::__cxx11::string>
                  ((OpCode *)&local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
        local_88._M_head_impl = local_80._M_head_impl;
        local_80._M_head_impl = (Arith2Inst *)0x0;
        std::
        vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
        ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                  ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                    *)this_00,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_88);
        break;
      }
    }
    uVar4 = *(undefined8 *)&j->bb_true;
    (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
    super__Optional_payload_base<backend::codegen::LastJump>._M_payload._M_value.cond = NotEqual;
    *(undefined8 *)
     ((long)&(this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>.
             _M_payload.super__Optional_payload_base<backend::codegen::LastJump>._M_payload + 4) =
         uVar4;
    if (cVar9 == '\0') {
      (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
      super__Optional_payload_base<backend::codegen::LastJump>._M_engaged = true;
    }
    local_78 = (undefined1  [4])0x18;
    pVVar11 = std::optional<mir::inst::VarId>::value(&j->cond_or_ret);
    local_40.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    local_40.id = pVVar11->id;
    local_74 = (undefined1  [4])translate_var_reg(this,&local_40);
    local_70._8_4_ = 0;
    local_70[0x18] = '\x01';
    local_70._0_8_ = &PTR_display_001db830;
    std::make_unique<arm::Arith2Inst,arm::OpCode,unsigned_int,arm::Operand2>
              ((OpCode *)&local_80,(uint *)local_78,(Operand2 *)local_74);
    local_88._M_head_impl = local_80._M_head_impl;
    local_80._M_head_impl = (Arith2Inst *)0x0;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)this_00,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_88);
    if (local_88._M_head_impl != (Arith2Inst *)0x0) {
      (*((local_88._M_head_impl)->super_Inst).super_Displayable._vptr_Displayable[2])();
    }
    local_88._M_head_impl = (Arith2Inst *)0x0;
    std::unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_>::~unique_ptr
              ((unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> *)&local_80);
    local_78 = (undefined1  [4])0x1;
    function_name_00._M_str._0_4_ = j->bb_false;
    function_name_00._M_len = (size_t)(this->func->name)._M_dataplus._M_p;
    function_name_00._M_str._4_4_ = 0;
    format_bb_label_abi_cxx11_
              ((string *)local_70,(codegen *)(this->func->name)._M_string_length,function_name_00,
               in_R8D);
    local_74 = (undefined1  [4])((uint)local_74 & 0xffffff00);
    std::make_unique<arm::BrInst,arm::OpCode,std::__cxx11::string,arm::ConditionCode>
              ((OpCode *)&local_80,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
               (ConditionCode *)local_70);
    local_88._M_head_impl = local_80._M_head_impl;
    local_80._M_head_impl = (Arith2Inst *)0x0;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)this_00,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_88);
    if (local_88._M_head_impl != (Arith2Inst *)0x0) {
      (*((local_88._M_head_impl)->super_Inst).super_Displayable._vptr_Displayable[2])();
    }
    local_88._M_head_impl = (Arith2Inst *)0x0;
    std::unique_ptr<arm::BrInst,_std::default_delete<arm::BrInst>_>::~unique_ptr
              ((unique_ptr<arm::BrInst,_std::default_delete<arm::BrInst>_> *)&local_80);
    std::__cxx11::string::~string((string *)local_70);
    local_78 = (undefined1  [4])0x1;
    function_name_01._M_str._0_4_ = j->bb_true;
    function_name_01._M_len = (size_t)(this->func->name)._M_dataplus._M_p;
    function_name_01._M_str._4_4_ = 0;
    format_bb_label_abi_cxx11_
              ((string *)local_70,(codegen *)(this->func->name)._M_string_length,function_name_01,
               in_R8D);
    std::make_unique<arm::BrInst,arm::OpCode,std::__cxx11::string>
              ((OpCode *)&local_80,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    local_88._M_head_impl = local_80._M_head_impl;
    local_80._M_head_impl = (Arith2Inst *)0x0;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)this_00,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_88);
    break;
  case Br:
    local_78 = (undefined1  [4])0x1;
    function_name_02._M_str._0_4_ = j->bb_true;
    function_name_02._M_len = (size_t)(this->func->name)._M_dataplus._M_p;
    function_name_02._M_str._4_4_ = 0;
    format_bb_label_abi_cxx11_
              ((string *)local_70,(codegen *)(this->func->name)._M_string_length,function_name_02,
               in_R8D);
    std::make_unique<arm::BrInst,arm::OpCode,std::__cxx11::string>
              ((OpCode *)&local_80,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    local_88._M_head_impl = local_80._M_head_impl;
    local_80._M_head_impl = (Arith2Inst *)0x0;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_88);
  }
  if (local_88._M_head_impl != (Arith2Inst *)0x0) {
    (*((local_88._M_head_impl)->super_Inst).super_Displayable._vptr_Displayable[2])();
  }
  local_88._M_head_impl = (Arith2Inst *)0x0;
  std::unique_ptr<arm::BrInst,_std::default_delete<arm::BrInst>_>::~unique_ptr
            ((unique_ptr<arm::BrInst,_std::default_delete<arm::BrInst>_> *)&local_80);
  std::__cxx11::string::~string((string *)local_70);
  return;
}

Assistant:

void Codegen::translate_branch(mir::inst::JumpInstruction& j) {
  last_jump = std::move(this_jump);
  this_jump = std::nullopt;
  switch (j.kind) {
    case mir::inst::JumpInstructionKind::Br:
      inst.push_back(std::make_unique<BrInst>(
          OpCode::B, format_bb_label(func.name, j.bb_true)));
      break;
    case mir::inst::JumpInstructionKind::BrCond: {
      auto back = inst.end() - 2;

      // Find if a comparison exists
      std::optional<ConditionCode> cond = std::nullopt;
      if (inst.size() >= 2) {
        auto b1 = back->get();
        auto b2 = (back + 1)->get();
        if (b1->op == arm::OpCode::Mov && b2->op == arm::OpCode::Mov) {
          auto b1m = dynamic_cast<Arith2Inst*>(b1);
          auto b2m = dynamic_cast<Arith2Inst*>(b2);
          if (b1m->r1 == b2m->r1 && b1m->r2 == 0 && b2m->r2 == 1 &&
              b1m->cond == arm::ConditionCode::Always &&
              b2m->cond != arm::ConditionCode::Always) {
            cond = {b2m->cond};
          }
        }
      }
      if (cond) {
        this_jump = LastJump{cond.value(), j.bb_true, j.bb_false};
        inst.pop_back();
        inst.pop_back();
        inst.push_back(std::make_unique<BrInst>(
            OpCode::B, format_bb_label(func.name, j.bb_false),
            invert_cond(cond.value())));
        inst.push_back(std::make_unique<BrInst>(
            OpCode::B, format_bb_label(func.name, j.bb_true)));
      } else {
        this_jump = LastJump{ConditionCode::NotEqual, j.bb_true, j.bb_false};
        inst.push_back(std::make_unique<Arith2Inst>(
            OpCode::Cmp, translate_var_reg(j.cond_or_ret.value()),
            Operand2(0)));
        inst.push_back(std::make_unique<BrInst>(
            OpCode::B, format_bb_label(func.name, j.bb_false),
            ConditionCode::Equal));
        inst.push_back(std::make_unique<BrInst>(
            OpCode::B, format_bb_label(func.name, j.bb_true)));
      }
    } break;
    case mir::inst::JumpInstructionKind::Return:
      if (j.cond_or_ret.has_value()) {
        // Move return value to its register
        // if (j.cond_or_ret.value().id != 0) {
        inst.push_back(std::make_unique<Arith2Inst>(
            OpCode::Mov, make_register(arm::RegisterKind::GeneralPurpose, 0),
            RegisterOperand(translate_var_reg(j.cond_or_ret.value()))));
        // }
      }
      inst.push_back(
          std::make_unique<BrInst>(OpCode::B, format_fn_end_label(func.name)));
      // Jumps to function end, the rest is cleanup generation in function
      // `generate_return_and_cleanup`
      break;
    case mir::inst::JumpInstructionKind::Undefined:
      // WARN: Error about undefined blocks
      throw new std::exception();
      break;
    case mir::inst::JumpInstructionKind::Unreachable:
      // TODO: Discard unreachable blocks beforhand
      break;
  }
}